

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::sortTests(IConfig *config,
                vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  iterator iVar4;
  iterator iVar5;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_RDX;
  long *in_RSI;
  TestCase *in_RDI;
  pair<unsigned_long,_const_Catch::TestCase_*> *hashed;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  *__range3_1;
  TestCase *testCase;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range3;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  indexed_tests;
  TestHasher h;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *sorted;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff08;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  *this;
  undefined4 in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  in_stack_ffffffffffffff18;
  TestCase *__args;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  __first;
  size_type in_stack_ffffffffffffff38;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff40;
  __normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
  in_stack_ffffffffffffff48;
  TestHasher *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff60;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_70;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_68;
  undefined1 local_60 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  undefined1 local_19;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_10;
  
  __first._M_current = in_RDI;
  local_18 = in_RDX;
  local_10._M_allocated_capacity = (size_type)in_RSI;
  iVar2 = (**(code **)(*in_RSI + 0x80))();
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      local_19 = 0;
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
                (in_stack_ffffffffffffff60,
                 (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                 CONCAT17(in_stack_ffffffffffffff5f,
                          CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
      local_30._8_8_ =
           clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     (in_stack_ffffffffffffff08);
      local_30._M_allocated_capacity =
           (size_type)
           clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                     (in_stack_ffffffffffffff08);
      std::
      sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>>
                (__first,in_stack_ffffffffffffff18);
      return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_RDI;
    }
    if (iVar2 == 2) {
      seedRng((IConfig *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      uVar3 = (**(code **)(*(long *)local_10._M_allocated_capacity + 0x88))();
      anon_unknown_1::TestHasher::TestHasher((TestHasher *)(local_60 + 0x18),(ulong)uVar3);
      __args = (TestCase *)local_60;
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::vector((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                *)0x12ca6d);
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(local_18);
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::reserve((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_68 = local_18;
      local_70._M_current =
           (TestCase *)
           clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     (in_stack_ffffffffffffff08);
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                (in_stack_ffffffffffffff08);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                 *)in_stack_ffffffffffffff08), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
        ::operator*(&local_70);
        in_stack_ffffffffffffff14 =
             anon_unknown_1::TestHasher::operator()
                       (in_stack_ffffffffffffff50,(TestCase *)in_stack_ffffffffffffff48._M_current);
        std::
        vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>
        ::emplace_back<unsigned_int,Catch::TestCase_const*>
                  ((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                    *)__first._M_current,(uint *)__args,
                   (TestCase **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        __gnu_cxx::
        __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
        ::operator++(&local_70);
      }
      this = (vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
              *)local_60;
      iVar4 = clara::std::
              vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
              ::begin(this);
      iVar5 = clara::std::
              vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
              ::end(this);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>
                (iVar4._M_current,iVar5._M_current);
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
                ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)0x12cba7);
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::size((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
              *)local_60);
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::begin(this);
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                (__normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
                                 *)this), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
        ::operator*((__normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
                     *)&stack0xffffffffffffff48);
        std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>::
        emplace_back<Catch::TestCase_const&>
                  ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)__first._M_current,
                   __args);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
        ::operator++((__normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
                      *)&stack0xffffffffffffff48);
      }
      clara::std::
      vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
      ::~vector((vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                 *)__first._M_current);
      return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_RDI;
    }
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            (in_stack_ffffffffffffff60,
             (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_RDI;
}

Assistant:

std::vector<TestCase> sortTests( IConfig const& config, std::vector<TestCase> const& unsortedTestCases ) {
        switch( config.runOrder() ) {
            case RunTests::InDeclarationOrder:
                // already in declaration order
                break;

            case RunTests::InLexicographicalOrder: {
                std::vector<TestCase> sorted = unsortedTestCases;
                std::sort( sorted.begin(), sorted.end() );
                return sorted;
            }

            case RunTests::InRandomOrder: {
                seedRng( config );
                TestHasher h{ config.rngSeed() };

                using hashedTest = std::pair<TestHasher::hash_t, TestCase const*>;
                std::vector<hashedTest> indexed_tests;
                indexed_tests.reserve( unsortedTestCases.size() );

                for (auto const& testCase : unsortedTestCases) {
                    indexed_tests.emplace_back(h(testCase), &testCase);
                }

                std::sort(indexed_tests.begin(), indexed_tests.end(),
                          [](hashedTest const& lhs, hashedTest const& rhs) {
                          if (lhs.first == rhs.first) {
                              return lhs.second->name < rhs.second->name;
                          }
                          return lhs.first < rhs.first;
                });

                std::vector<TestCase> sorted;
                sorted.reserve( indexed_tests.size() );

                for (auto const& hashed : indexed_tests) {
                    sorted.emplace_back(*hashed.second);
                }

                return sorted;
            }
        }
        return unsortedTestCases;
    }